

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O2

void __thiscall
icu_63::NoopNormalizer2::normalizeUTF8
          (NoopNormalizer2 *this,uint32_t options,StringPiece src,ByteSink *sink,Edits *edits,
          UErrorCode *errorCode)

{
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  if (edits != (Edits *)0x0) {
    if ((options >> 0xd & 1) == 0) {
      Edits::reset(edits);
    }
    Edits::addUnchanged(edits,src.length_);
  }
  if ((options >> 0xe & 1) == 0) {
    (*sink->_vptr_ByteSink[2])(sink,src.ptr_,(ulong)(uint)src.length_);
  }
  (*sink->_vptr_ByteSink[4])(sink);
  return;
}

Assistant:

virtual void
    normalizeUTF8(uint32_t options, StringPiece src, ByteSink &sink,
                  Edits *edits, UErrorCode &errorCode) const U_OVERRIDE {
        if(U_SUCCESS(errorCode)) {
            if (edits != nullptr) {
                if ((options & U_EDITS_NO_RESET) == 0) {
                    edits->reset();
                }
                edits->addUnchanged(src.length());
            }
            if ((options & U_OMIT_UNCHANGED_TEXT) == 0) {
                sink.Append(src.data(), src.length());
            }
            sink.Flush();
        }
    }